

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O1

void skipblock(int level,char start,char end)

{
  char cVar1;
  
  while( true ) {
    do {
      while( true ) {
        skip();
        cVar1 = *s;
        if (cVar1 == '\0') {
          return;
        }
        s = s + 1;
        if (cVar1 != start) break;
        level = level + 1;
      }
    } while (cVar1 != end);
    if (level < 2) break;
    level = level + -1;
  }
  return;
}

Assistant:

void skipblock(int level,char start,char end)
/* skips a block between the two specified start- and end-characters */
{
  char c;

  while (c = getchr()) {
    if (c == start) {
      ++level;
    }
    else if (c == end) {
      if (--level <= 0)
        break;
    }
  }
}